

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

QTextLayout * __thiscall QTextCursorPrivate::blockLayout(QTextCursorPrivate *this,QTextBlock *block)

{
  int iVar1;
  QTextLayout *pQVar2;
  QAbstractTextDocumentLayout *pQVar3;
  undefined8 in_RSI;
  QTextBlock *in_RDI;
  long in_FS_OFFSET;
  QTextLayout *tl;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QTextBlock::layout(in_RDI);
  iVar1 = QTextLayout::lineCount((QTextLayout *)0x79f713);
  if (iVar1 == 0) {
    pQVar3 = QTextDocumentPrivate::layout(*(QTextDocumentPrivate **)&in_RDI->n);
    if (pQVar3 != (QAbstractTextDocumentLayout *)0x0) {
      pQVar3 = QTextDocumentPrivate::layout(*(QTextDocumentPrivate **)&in_RDI->n);
      (**(code **)(*(long *)pQVar3 + 0x88))(local_28,pQVar3,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QTextLayout *QTextCursorPrivate::blockLayout(QTextBlock &block) const{
    QTextLayout *tl = block.layout();
    if (!tl->lineCount() && priv->layout())
        priv->layout()->blockBoundingRect(block);
    return tl;
}